

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::BVC_RL(CPU *this)

{
  char cVar1;
  int iVar2;
  
  this->cycles = 2;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  cVar1 = (char)iVar2;
  if (((this->field_6).ps & 0x40) != 0) {
    cVar1 = '\0';
  }
  this->cycles = this->cycles - 1;
  this->pc = (short)cVar1 + this->pc + 1;
  return;
}

Assistant:

void CPU::BVC_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (!V) ? static_cast<int8_t>(offset) : 0;
}